

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int8_suite::fail_array32_int8_missing_length_two(void)

{
  value_type input [3];
  decoder decoder;
  uchar local_44 [4];
  undefined4 local_40;
  value local_3c;
  decoder local_38;
  
  local_38.input._M_str = local_44;
  local_44[2] = 0;
  local_44[0] = 200;
  local_44[1] = '\x01';
  local_38.input._M_len = 3;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_3c = local_38.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x62b,"void compact_int8_suite::fail_array32_int8_missing_length_two()",&local_3c,
             &local_40);
  return;
}

Assistant:

void fail_array32_int8_missing_length_two()
{
    const value_type input[] = { token::code::array32_int8, 0x01, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}